

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
           (uint *begin,uint *end)

{
  uint *puVar1;
  double *pdVar2;
  double dVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
  pVar12;
  
  uVar5 = *begin;
  dVar3 = *(double *)(begin + 2);
  lVar7 = 0x10;
  while( true ) {
    uVar11 = *(uint *)((long)begin + lVar7);
    uVar6 = (ulong)uVar11;
    if (((int)uVar5 <= (int)uVar11) &&
       (((int)uVar5 < (int)uVar11 ||
        (pdVar2 = (double *)((long)begin + lVar7 + 8), dVar3 < *pdVar2 || dVar3 == *pdVar2))))
    break;
    lVar7 = lVar7 + 0x10;
  }
  puVar1 = (uint *)((long)begin + lVar7);
  if (lVar7 == 0x10) {
    while (puVar9 = end, end = puVar9, puVar1 < puVar9) {
      end = puVar9 + -4;
      if (((int)puVar9[-4] < (int)uVar5) ||
         (((int)puVar9[-4] <= (int)uVar5 &&
          (*(double *)(puVar9 + -2) <= dVar3 && dVar3 != *(double *)(puVar9 + -2))))) break;
    }
  }
  else {
    do {
      puVar9 = end;
      end = puVar9 + -4;
      if ((int)puVar9[-4] < (int)uVar5) break;
    } while (((int)uVar5 < (int)puVar9[-4]) ||
            (dVar3 < *(double *)(puVar9 + -2) || dVar3 == *(double *)(puVar9 + -2)));
  }
  puVar9 = puVar1;
  if (puVar1 < end) {
    uVar11 = *end;
    puVar10 = end;
    do {
      *puVar9 = uVar11;
      *puVar10 = (uint)uVar6;
      uVar4 = *(undefined8 *)(puVar9 + 2);
      *(undefined8 *)(puVar9 + 2) = *(undefined8 *)(puVar10 + 2);
      *(undefined8 *)(puVar10 + 2) = uVar4;
      do {
        do {
          puVar8 = puVar9;
          puVar9 = puVar8 + 4;
          uVar11 = *puVar9;
          uVar6 = (ulong)uVar11;
        } while ((int)uVar11 < (int)uVar5);
      } while (((int)uVar11 <= (int)uVar5) &&
              (pdVar2 = (double *)(puVar8 + 6), *pdVar2 <= dVar3 && dVar3 != *pdVar2));
      do {
        puVar8 = puVar10;
        uVar11 = puVar8[-4];
        puVar10 = puVar8 + -4;
        if ((int)uVar11 < (int)uVar5) break;
      } while (((int)uVar5 < (int)uVar11) ||
              (dVar3 < *(double *)(puVar8 + -2) || dVar3 == *(double *)(puVar8 + -2)));
    } while (puVar9 < puVar10);
  }
  pVar12._9_7_ = (undefined7)(uVar6 >> 8);
  pVar12.second = end <= puVar1;
  *begin = puVar9[-4];
  *(undefined8 *)(begin + 2) = *(undefined8 *)(puVar9 + -2);
  puVar9[-4] = uVar5;
  *(double *)(puVar9 + -2) = dVar3;
  pVar12.first._M_current = (pair<int,_double> *)(puVar9 + -4);
  return pVar12;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }